

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O0

void __thiscall QtPrivate::QColorPicker::paintEvent(QColorPicker *this,QPaintEvent *param_2)

{
  QPoint this_00;
  QPoint QVar1;
  QPoint *in_RSI;
  QColorPicker *in_RDI;
  long in_FS_OFFSET;
  QPoint pt;
  QRect r;
  QPainter p;
  QRect *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  GlobalColor c;
  QColorPicker *this_01;
  undefined1 *local_20;
  QColor local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  this_01 = in_RDI;
  QPainter::QPainter((QPainter *)&local_20,&(in_RDI->super_QFrame).super_QWidget.super_QPaintDevice)
  ;
  QFrame::drawFrame(&in_RDI->super_QFrame,
                    (QPainter *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  QWidget::contentsRect((QWidget *)in_RDI);
  QRect::topLeft(in_stack_ffffffffffffff88);
  QPainter::drawPixmap((QPainter *)this_01,in_RSI,(QPixmap *)in_RDI);
  if ((in_RDI->crossVisible & 1U) != 0) {
    this_00 = colPt(this_01);
    QVar1 = QRect::topLeft(in_stack_ffffffffffffff88);
    ::operator+(in_RSI,(QPoint *)in_RDI);
    c = (GlobalColor)((ulong)in_RSI >> 0x20);
    QColor::QColor(&local_18,black);
    QPainter::setPen((QColor *)&local_20);
    QPoint::x((QPoint *)0x7339eb);
    QPoint::y((QPoint *)0x7339fc);
    QPainter::fillRect((QPainter *)this_00,QVar1.yp.m_i.m_i,QVar1.xp.m_i.m_i,
                       (int)((ulong)this_01 >> 0x20),(int)this_01,c);
    QPoint::x((QPoint *)0x733a24);
    QPoint::y((QPoint *)0x733a32);
    QPainter::fillRect((QPainter *)this_00,QVar1.yp.m_i.m_i,QVar1.xp.m_i.m_i,
                       (int)((ulong)this_01 >> 0x20),(int)this_01,c);
  }
  QPainter::~QPainter((QPainter *)&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorPicker::paintEvent(QPaintEvent* )
{
    QPainter p(this);
    drawFrame(&p);
    QRect r = contentsRect();

    p.drawPixmap(r.topLeft(), pix);

    if (crossVisible) {
        QPoint pt = colPt() + r.topLeft();
        p.setPen(Qt::black);
        p.fillRect(pt.x()-9, pt.y(), 20, 2, Qt::black);
        p.fillRect(pt.x(), pt.y()-9, 2, 20, Qt::black);
    }
}